

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::debug_process_summaryfile(aalcalc *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  mapped_type *pmVar6;
  DIR *__dirp;
  dirent *pdVar7;
  undefined8 extraout_RAX;
  FILE *unaff_RBX;
  char *__rhs;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  bool bVar8;
  sampleslevelRec sr;
  int summary_set;
  summarySampleslevelHeader sh;
  int summarycalcstream_type;
  string sStack_f0;
  undefined1 auStack_d0 [32];
  _Rb_tree_node_base *p_Stack_b0;
  _Rb_tree_node_base _Stack_a0;
  uint local_54;
  float local_50;
  undefined4 local_4c;
  double local_48;
  _Rb_tree_color local_40;
  uint local_3c;
  uint local_34;
  
  __rhs = "rb";
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    debug_process_summaryfile((aalcalc *)filename);
  }
  else {
    local_34 = 0;
    __rhs = (char *)0x4;
    fread(&local_34,4,1,__stream);
    filename = (string *)(ulong)(local_34 & 0x3000000);
    unaff_RBX = __stream;
    if ((local_34 & 0x3000000) == 0x3000000) {
      if ((local_34 & 0xffffff) == 1) {
        local_4c = 0;
        sVar5 = fread(&this->samplesize_,4,1,__stream);
        if (sVar5 == 0) {
          puts("event_id,period_no,summary_id,sidx,loss");
        }
        else {
          sVar5 = fread(&local_4c,4,1,__stream);
          puts("event_id,period_no,summary_id,sidx,loss");
          if (sVar5 != 0) {
            this_00 = &this->event_to_period_;
            do {
              sVar5 = fread(&local_40,0xc,1,__stream);
              if (sVar5 == 0) break;
              sVar5 = fread(&local_54,8,1,__stream);
              bVar8 = sVar5 == 0;
              if (local_54 != 0 && !bVar8) {
                do {
                  uVar3 = local_54;
                  pmVar6 = std::
                           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           ::operator[](this_00,(key_type *)&local_40);
                  puVar2 = (uint *)(pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start;
                  pmVar6 = std::
                           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           ::operator[](this_00,(key_type *)&local_40);
                  if (puVar2 != (uint *)(pmVar6->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish) {
                    local_48 = (double)local_50;
                    do {
                      printf("%d,%d,%d,%d,%f\n",local_48,(ulong)local_40,(ulong)*puVar2,
                             (ulong)local_3c,(ulong)uVar3);
                      pmVar6 = std::
                               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               ::operator[](this_00,(key_type *)&local_40);
                    } while (puVar2 != (uint *)(pmVar6->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish);
                  }
                  sVar5 = fread(&local_54,8,1,__stream);
                  bVar8 = sVar5 == 0;
                } while ((!bVar8) && (local_54 != 0));
              }
            } while (!bVar8);
          }
        }
      }
      fclose(__stream);
      return;
    }
  }
  debug_process_summaryfile((aalcalc *)filename);
  _Stack_a0._M_left = (_Base_ptr)filename;
  _Stack_a0._M_right = (_Base_ptr)unaff_RBX;
  loadoccurrence((aalcalc *)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d0,
                 "work/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
  ;
  std::__cxx11::string::substr((ulong)&sStack_f0,(ulong)auStack_d0);
  iVar4 = std::__cxx11::string::compare((char *)&sStack_f0);
  paVar1 = &sStack_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_f0._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_f0._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    sStack_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_f0,auStack_d0._0_8_,(char *)(auStack_d0._0_8_ + auStack_d0._8_8_));
    std::__cxx11::string::append((char *)&sStack_f0);
    std::__cxx11::string::operator=((string *)auStack_d0,(string *)&sStack_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_f0._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_f0._M_dataplus._M_p);
    }
  }
  __dirp = opendir((char *)auStack_d0._0_8_);
  if (__dirp == (DIR *)0x0) {
    debug((aalcalc *)auStack_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_f0._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_f0._M_dataplus._M_p);
    }
    if ((undefined1 *)auStack_d0._0_8_ != auStack_d0 + 0x10) {
      operator_delete((void *)auStack_d0._0_8_);
    }
    _Unwind_Resume(extraout_RAX);
  }
  while (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0) {
    sStack_f0._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(pdVar7->d_name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sStack_f0,pdVar7->d_name,pdVar7->d_name + sVar5);
    if (4 < sStack_f0._M_string_length) {
      std::__cxx11::string::substr((ulong)&p_Stack_b0,(ulong)&sStack_f0);
      iVar4 = std::__cxx11::string::compare((char *)&p_Stack_b0);
      if (p_Stack_b0 != &_Stack_a0) {
        operator_delete(p_Stack_b0);
      }
      if (iVar4 == 0) {
        p_Stack_b0 = &_Stack_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Stack_b0,auStack_d0._0_8_,
                   (char *)(auStack_d0._0_8_ + auStack_d0._8_8_));
        std::__cxx11::string::append((char *)&p_Stack_b0);
        std::__cxx11::string::operator=((string *)&sStack_f0,(string *)&p_Stack_b0);
        if (p_Stack_b0 != &_Stack_a0) {
          operator_delete(p_Stack_b0);
        }
        debug_process_summaryfile((aalcalc *)_Stack_a0._M_left,&sStack_f0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_f0._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_f0._M_dataplus._M_p);
    }
  }
  if ((undefined1 *)auStack_d0._0_8_ != auStack_d0 + 0x10) {
    operator_delete((void *)auStack_d0._0_8_);
  }
  return;
}

Assistant:

void aalcalc::debug_process_summaryfile(const std::string &filename)
{
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL:%s: Not a summarycalc stream type %d\n", __func__, stream_type);
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1) {
		int summary_set = 0;
		i = fread(&samplesize_, sizeof(samplesize_), 1, fin);
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		printf("event_id,period_no,summary_id,sidx,loss\n");
		summarySampleslevelHeader sh;
		int j = 0;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i == 0) break;
				if (sr.sidx == 0) break;
				auto p_iter = event_to_period_[sh.event_id].begin();
				while (p_iter != event_to_period_[sh.event_id].end()) {
					printf("%d,%d,%d,%d,%f\n", sh.event_id, *p_iter, sh.summary_id, sr.sidx, sr.loss);
				}

			}
			j++;
		}		
	}

	fclose(fin);
}